

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O0

void __thiscall
AmsConnection::AmsConnection(AmsConnection *this,Router *__router,addrinfo *destination)

{
  uint32_t uVar1;
  AmsConnection *local_50;
  code *local_48;
  undefined8 local_40;
  thread local_38 [3];
  addrinfo *local_20;
  addrinfo *destination_local;
  Router *__router_local;
  AmsConnection *this_local;
  
  this->router = __router;
  local_20 = destination;
  destination_local = (addrinfo *)__router;
  __router_local = (Router *)this;
  TcpSocket::TcpSocket(&this->socket,destination);
  std::thread::thread(&this->receiver);
  std::atomic<unsigned_long>::atomic(&this->refCount,0);
  std::atomic<unsigned_int>::atomic(&this->invokeId,0);
  std::array<AmsResponse,_128UL>::array(&this->queue);
  std::
  map<std::pair<unsigned_short,_AmsAddr>,_std::shared_ptr<NotificationDispatcher>,_std::less<std::pair<unsigned_short,_AmsAddr>_>,_std::allocator<std::pair<const_std::pair<unsigned_short,_AmsAddr>,_std::shared_ptr<NotificationDispatcher>_>_>_>
  ::map(&this->dispatcherList);
  std::recursive_mutex::recursive_mutex(&this->dispatcherListMutex);
  uVar1 = TcpSocket::Connect(&this->socket);
  this->ownIp = uVar1;
  local_48 = TryRecv;
  local_40 = 0;
  local_50 = this;
  std::thread::thread<void(AmsConnection::*)(),AmsConnection*,void>
            (local_38,(type *)&local_48,&local_50);
  std::thread::operator=(&this->receiver,local_38);
  std::thread::~thread(local_38);
  return;
}

Assistant:

AmsConnection::AmsConnection(Router& __router, const struct addrinfo* const destination)
    : router(__router),
    socket(destination),
    refCount(0),
    invokeId(0),
    ownIp(socket.Connect())
{
    receiver = std::thread(&AmsConnection::TryRecv, this);
}